

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5ApiPhraseNextColumn(Fts5Context *pCtx,Fts5PhraseIter *pIter,int *piCol)

{
  uchar *puVar1;
  uint uVar2;
  uchar *puVar3;
  int dummy;
  int iIncr;
  u32 local_30;
  u32 local_2c;
  
  if (*(int *)(*(long *)(*(long *)pCtx + 0x18) + 0x5c) == 2) {
    puVar3 = pIter->a;
    if (puVar3 < pIter->b) {
      uVar2 = sqlite3Fts5GetVarint32(puVar3,&local_2c);
      pIter->a = puVar3 + uVar2;
      *piCol = local_2c + *piCol + -2;
      return;
    }
  }
  else {
    puVar3 = pIter->a;
    puVar1 = pIter->b;
    if (puVar3 < puVar1) {
      do {
        if (*puVar3 == '\x01') {
          uVar2 = sqlite3Fts5GetVarint32(puVar3 + 1,(u32 *)piCol);
          pIter->a = pIter->a + (ulong)uVar2 + 1;
          return;
        }
        uVar2 = sqlite3Fts5GetVarint32(puVar3,&local_30);
        puVar3 = puVar3 + uVar2;
        pIter->a = puVar3;
      } while (puVar3 < puVar1);
    }
  }
  *piCol = -1;
  return;
}

Assistant:

static void fts5ApiPhraseNextColumn(
  Fts5Context *pCtx, 
  Fts5PhraseIter *pIter, 
  int *piCol
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;

  if( pConfig->eDetail==FTS5_DETAIL_COLUMNS ){
    if( pIter->a>=pIter->b ){
      *piCol = -1;
    }else{
      int iIncr;
      pIter->a += fts5GetVarint32(&pIter->a[0], iIncr);
      *piCol += (iIncr-2);
    }
  }else{
    while( 1 ){
      int dummy;
      if( pIter->a>=pIter->b ){
        *piCol = -1;
        return;
      }
      if( pIter->a[0]==0x01 ) break;
      pIter->a += fts5GetVarint32(pIter->a, dummy);
    }
    pIter->a += 1 + fts5GetVarint32(&pIter->a[1], *piCol);
  }
}